

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_json.cpp
# Opt level: O0

string * __thiscall
ritobin::io::json_impl::ErrorStack::trace_abi_cxx11_
          (string *__return_storage_ptr__,ErrorStack *this)

{
  ErrorStack *this_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (__return_storage_ptr__,"read ");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (__return_storage_ptr__,this->type);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (__return_storage_ptr__," ");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (__return_storage_ptr__,this->message);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (__return_storage_ptr__," at ");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (__return_storage_ptr__,&this->path);
  return __return_storage_ptr__;
}

Assistant:

std::string trace() const noexcept {
            std::string result = {};
            result += "read ";
            result += this->type;
            result += " ";
            result += this->message;
            result += " at ";
            result += this->path;
            return result;
        }